

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O1

void __thiscall duckdb::ListTypeInfo::ListTypeInfo(ListTypeInfo *this)

{
  (this->super_ExtraTypeInfo).type = LIST_TYPE_INFO;
  (this->super_ExtraTypeInfo).alias._M_dataplus._M_p =
       (pointer)&(this->super_ExtraTypeInfo).alias.field_2;
  (this->super_ExtraTypeInfo).alias._M_string_length = 0;
  (this->super_ExtraTypeInfo).alias.field_2._M_local_buf[0] = '\0';
  (this->super_ExtraTypeInfo).extension_info.
  super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl = (ExtensionTypeInfo *)0x0
  ;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo = (_func_int **)&PTR__ListTypeInfo_019a7b28;
  LogicalType::LogicalType(&this->child_type);
  return;
}

Assistant:

ListTypeInfo::ListTypeInfo() : ExtraTypeInfo(ExtraTypeInfoType::LIST_TYPE_INFO) {
}